

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RedirectedStdOut::RedirectedStdOut(RedirectedStdOut *this)

{
  ostream *poVar1;
  long lVar2;
  
  ReusableStringStream::ReusableStringStream(&this->m_rss);
  poVar1 = (this->m_rss).m_oss;
  (this->m_cout).m_originalStream = (ostream *)&std::cout;
  (this->m_cout).m_redirectionStream = poVar1;
  lVar2 = std::cout;
  (this->m_cout).m_prevBuf = *(streambuf **)(std::ifstream::ifstream + *(long *)(std::cout + -0x18))
  ;
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(lVar2 + -0x18)));
  return;
}

Assistant:

RedirectedStdOut::RedirectedStdOut() : m_cout( Catch::cout(), m_rss.get() ) {}